

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cc
# Opt level: O2

void __thiscall leveldb::Table::Rep::~Rep(Rep *this)

{
  long lVar1;
  Block *this_00;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  operator_delete(this->filter,0x28);
  if (this->filter_data != (char *)0x0) {
    operator_delete__(this->filter_data);
  }
  this_00 = this->index_block;
  if (this_00 != (Block *)0x0) {
    Block::~Block(this_00);
  }
  operator_delete(this_00,0x18);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    Status::~Status(&this->status);
    return;
  }
  __stack_chk_fail();
}

Assistant:

~Rep() {
    delete filter;
    delete[] filter_data;
    delete index_block;
  }